

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int dup_typedef_check(char *type,lys_tpdf *tpdf,int size)

{
  int iVar1;
  int local_28;
  int i;
  int size_local;
  lys_tpdf *tpdf_local;
  char *type_local;
  
  local_28 = 0;
  while( true ) {
    if (size <= local_28) {
      return 0;
    }
    iVar1 = strcmp(type,tpdf[local_28].name);
    if (iVar1 == 0) break;
    local_28 = local_28 + 1;
  }
  return 1;
}

Assistant:

int
dup_typedef_check(const char *type, struct lys_tpdf *tpdf, int size)
{
    int i;

    for (i = 0; i < size; i++) {
        if (!strcmp(type, tpdf[i].name)) {
            /* name collision */
            return EXIT_FAILURE;
        }
    }

    return EXIT_SUCCESS;
}